

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

UtxoData * __thiscall cfd::Psbt::GetUtxoData(Psbt *this,uint32_t index,NetType net_type)

{
  bool bVar1;
  AddressType AVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  undefined8 uVar7;
  NetType in_ECX;
  long lVar8;
  uint in_EDX;
  Psbt *in_RSI;
  UtxoData *in_RDI;
  DescriptorScriptReference ref;
  Descriptor desc;
  KeyData *key;
  iterator __end6;
  iterator __begin6;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range6;
  bool is_find;
  Pubkey *pubkey;
  iterator __end5;
  iterator __begin5;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__range5;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> multisig_key_list;
  uint32_t req_num;
  ByteData last_data_1;
  uint32_t last_index_1;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  Script scriptsig;
  ByteData last_data;
  uint32_t last_index;
  wally_tx_witness_stack *witness_stack;
  bool is_finalized;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  wally_tx_output *output;
  bool witness_only;
  wally_psbt *psbt_pointer;
  UtxoData *utxo;
  undefined4 in_stack_ffffffffffffe9e8;
  undefined4 in_stack_ffffffffffffe9ec;
  UtxoData *in_stack_ffffffffffffe9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe9f8;
  allocator *paVar9;
  undefined2 in_stack_ffffffffffffea00;
  byte in_stack_ffffffffffffea02;
  undefined1 in_stack_ffffffffffffea03;
  HardenedType in_stack_ffffffffffffea04;
  undefined8 in_stack_ffffffffffffea08;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffea10;
  CfdException *this_00;
  uint in_stack_ffffffffffffea1c;
  HardenedType HVar10;
  undefined6 in_stack_ffffffffffffea30;
  undefined1 in_stack_ffffffffffffea36;
  byte in_stack_ffffffffffffea37;
  reference in_stack_ffffffffffffea38;
  undefined4 in_stack_ffffffffffffea50;
  undefined4 in_stack_ffffffffffffea54;
  Address local_1538;
  undefined1 local_13ba;
  allocator local_13b9;
  string local_13b8 [32];
  CfdSourceLocation local_1398;
  Script local_1380;
  DescriptorScriptReference local_1348;
  Descriptor local_ff8;
  string local_e90;
  string local_e70 [32];
  string local_e50 [38];
  undefined1 local_e2a;
  undefined1 local_e29 [33];
  CfdSourceLocation local_e08;
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70;
  string local_d50;
  string local_d30 [32];
  string local_d10 [38];
  undefined1 local_cea;
  allocator local_ce9;
  string local_ce8 [32];
  CfdSourceLocation local_cc8;
  string local_cb0;
  string local_c90 [32];
  string local_c70;
  string local_c50 [32];
  Pubkey local_c30;
  reference local_c18;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_c10;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_c08;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_c00;
  byte local_bf1;
  reference local_bf0;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_be8;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_be0;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *local_bd8;
  string local_bd0 [32];
  string local_bb0 [32];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_b90;
  uint32_t local_b74;
  string local_b70 [32];
  string local_b50 [32];
  string local_b30;
  string local_b10 [32];
  string local_af0 [38];
  undefined1 local_aca;
  allocator local_ac9;
  string local_ac8 [32];
  CfdSourceLocation local_aa8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_a90;
  ByteData local_a78;
  Script local_a60;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_a28;
  ByteData local_a10;
  Script local_9f8;
  ByteData local_9c0;
  allocator local_9a1;
  string local_9a0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_980;
  ByteData local_968;
  Pubkey local_950;
  KeyData local_938;
  Script local_7e8;
  ByteData local_7b0;
  allocator local_791;
  string local_790;
  ByteData local_770;
  Pubkey local_758;
  KeyData local_740;
  ByteData local_5f0;
  int local_5d4;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_5d0;
  ByteData local_5b8;
  Script local_5a0;
  ByteData local_568;
  allocator local_549;
  string local_548;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_528;
  ByteData local_510;
  Pubkey local_4f8;
  KeyData local_4e0;
  Script local_390;
  ByteData local_358;
  allocator local_339;
  string local_338;
  ByteData local_318;
  Pubkey local_300;
  KeyData local_2e8;
  ByteData local_198;
  int local_17c;
  long *local_178;
  byte local_169;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_168;
  ByteData local_150;
  Script local_138;
  Amount local_100;
  int64_t *local_f0;
  ByteData local_e8;
  Script local_d0;
  Amount local_98;
  byte local_85;
  ByteData local_78;
  ByteData256 local_60;
  Txid local_48;
  byte local_21;
  void *local_20;
  NetType local_18;
  uint local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  (*in_RSI->_vptr_Psbt[2])(in_RSI,(ulong)in_EDX,0x2d2,"GetUtxoData");
  local_20 = in_RSI->wally_psbt_pointer_;
  local_21 = 0;
  UtxoData::UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffea54,in_stack_ffffffffffffea50));
  in_RDI->block_height = 0;
  in_RDI->address_type = kP2shAddress;
  core::ByteData::ByteData
            (&local_78,
             (uint8_t *)(*(long *)(*(long *)((long)local_20 + 8) + 8) + (ulong)local_14 * 0xd0),0x20
            );
  core::ByteData256::ByteData256(&local_60,&local_78);
  core::Txid::Txid(&local_48,&local_60);
  core::Txid::operator=(&in_RDI->txid,&local_48);
  core::Txid::~Txid((Txid *)0x51f541);
  core::ByteData256::~ByteData256((ByteData256 *)0x51f54e);
  core::ByteData::~ByteData((ByteData *)0x51f55b);
  in_RDI->vout = *(uint32_t *)
                  (*(long *)(*(long *)((long)local_20 + 8) + 8) + (ulong)local_14 * 0xd0 + 0x20);
  local_85 = 0;
  if (*(long *)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110 + 8) == 0) {
    if ((*(long *)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110) != 0) &&
       ((ulong)in_RDI->vout <
        *(ulong *)(*(long *)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110) + 0x28))) {
      local_f0 = (int64_t *)
                 (*(long *)(*(long *)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110) +
                           0x20) + (ulong)in_RDI->vout * 0x70);
      core::Amount::Amount(&local_100,*local_f0);
      (in_RDI->amount).ignore_check_ = local_100.ignore_check_;
      (in_RDI->amount).amount_ = local_100.amount_;
      core::ByteData::ByteData(&local_150,(uint8_t *)local_f0[1],*(uint32_t *)(local_f0 + 2));
      core::Script::Script(&local_138,&local_150);
      core::Script::operator=(&in_RDI->locking_script,&local_138);
      core::Script::~Script((Script *)in_stack_ffffffffffffe9f0);
      core::ByteData::~ByteData((ByteData *)0x51f8ae);
    }
  }
  else {
    core::Amount::Amount
              (&local_98,
               **(int64_t **)(*(long *)((long)local_20 + 0x10) + 8 + (ulong)local_14 * 0x110));
    (in_RDI->amount).ignore_check_ = local_98.ignore_check_;
    (in_RDI->amount).amount_ = local_98.amount_;
    lVar8 = *(long *)(*(long *)((long)local_20 + 0x10) + 8 + (ulong)local_14 * 0x110);
    core::ByteData::ByteData(&local_e8,*(uint8_t **)(lVar8 + 8),*(uint32_t *)(lVar8 + 0x10));
    core::Script::Script(&local_d0,&local_e8);
    core::Script::operator=(&in_RDI->locking_script,&local_d0);
    core::Script::~Script((Script *)in_stack_ffffffffffffe9f0);
    core::ByteData::~ByteData((ByteData *)0x51f690);
    local_85 = 1;
  }
  bVar1 = core::Script::IsP2shScript(&in_RDI->locking_script);
  if (bVar1) {
    in_RDI->address_type = kP2shAddress;
  }
  else {
    bVar1 = core::Script::IsP2pkhScript(&in_RDI->locking_script);
    if (bVar1) {
      in_RDI->address_type = kP2pkhAddress;
    }
    else {
      bVar1 = core::Script::IsP2wpkhScript(&in_RDI->locking_script);
      if (bVar1) {
        in_RDI->address_type = kP2wpkhAddress;
      }
      else {
        bVar1 = core::Script::IsP2wshScript(&in_RDI->locking_script);
        if (bVar1) {
          in_RDI->address_type = kP2wshAddress;
        }
      }
    }
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector(&local_168);
  local_169 = core::Psbt::IsFinalizedInput(in_RSI,local_14);
  if ((bool)local_169) {
    if (((local_85 & 1) == 0) ||
       (*(long *)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110 + 0x40) == 0)) {
      if (*(long *)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110 + 0x30) != 0) {
        core::ByteData::ByteData
                  (&local_5b8,
                   *(uint8_t **)(*(long *)((long)local_20 + 0x10) + 0x30 + (ulong)local_14 * 0x110),
                   *(uint32_t *)(*(long *)((long)local_20 + 0x10) + 0x38 + (ulong)local_14 * 0x110))
        ;
        core::Script::Script(&local_5a0,&local_5b8);
        core::ByteData::~ByteData((ByteData *)0x5200ab);
        core::Script::GetElementList(&local_5d0,&local_5a0);
        sVar4 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                size(&local_5d0);
        local_5d4 = (int)sVar4;
        if (local_5d4 != 0) {
          pvVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ::operator[](&local_5d0,(ulong)(local_5d4 - 1));
          core::ScriptElement::GetBinaryData(&local_5f0,pvVar3);
          bVar1 = core::Pubkey::IsValid(&local_5f0);
          if (bVar1) {
            core::ByteData::ByteData
                      ((ByteData *)in_stack_ffffffffffffe9f0,
                       (ByteData *)CONCAT44(in_stack_ffffffffffffe9ec,in_stack_ffffffffffffe9e8));
            core::Pubkey::Pubkey(&local_758,&local_770);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_790,"",&local_791);
            core::ByteData::ByteData(&local_7b0);
            core::KeyData::KeyData(&local_740,&local_758,&local_790,&local_7b0);
            std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
            emplace_back<cfd::core::KeyData>(&local_168,&local_740);
            core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe9f0);
            core::ByteData::~ByteData((ByteData *)0x5201fc);
            std::__cxx11::string::~string((string *)&local_790);
            std::allocator<char>::~allocator((allocator<char> *)&local_791);
            core::Pubkey::~Pubkey((Pubkey *)0x520223);
            core::ByteData::~ByteData((ByteData *)0x520230);
          }
          else {
            core::Script::Script(&local_7e8,&local_5f0);
            core::Script::operator=(&in_RDI->redeem_script,&local_7e8);
            core::Script::~Script((Script *)in_stack_ffffffffffffe9f0);
            bVar1 = core::Script::IsP2pkScript(&in_RDI->redeem_script);
            if (bVar1) {
              core::Script::GetElementList(&local_980,&in_RDI->redeem_script);
              pvVar3 = std::
                       vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                       operator[](&local_980,0);
              core::ScriptElement::GetData(&local_968,pvVar3);
              core::Pubkey::Pubkey(&local_950,&local_968);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_9a0,"",&local_9a1);
              core::ByteData::ByteData(&local_9c0);
              core::KeyData::KeyData(&local_938,&local_950,&local_9a0,&local_9c0);
              std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
              emplace_back<cfd::core::KeyData>(&local_168,&local_938);
              core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe9f0);
              core::ByteData::~ByteData((ByteData *)0x5204c9);
              std::__cxx11::string::~string((string *)&local_9a0);
              std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
              core::Pubkey::~Pubkey((Pubkey *)0x5204f0);
              core::ByteData::~ByteData((ByteData *)0x5204fd);
              std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              ~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *
                      )CONCAT44(in_stack_ffffffffffffea04,
                                CONCAT13(in_stack_ffffffffffffea03,
                                         CONCAT12(in_stack_ffffffffffffea02,
                                                  in_stack_ffffffffffffea00))));
            }
          }
          core::ByteData::~ByteData((ByteData *)0x520629);
        }
        std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   CONCAT44(in_stack_ffffffffffffea04,
                            CONCAT13(in_stack_ffffffffffffea03,
                                     CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00)))
                  );
        core::Script::~Script((Script *)in_stack_ffffffffffffe9f0);
      }
    }
    else {
      local_178 = *(long **)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110 + 0x40);
      local_17c = (int)local_178[1];
      if (local_17c != 0) {
        lVar8 = (ulong)(local_17c - 1) * 0x10;
        core::ByteData::ByteData
                  (&local_198,*(uint8_t **)(*local_178 + lVar8),
                   *(uint32_t *)(*local_178 + 8 + lVar8));
        bVar1 = core::Pubkey::IsValid(&local_198);
        if (bVar1) {
          core::ByteData::ByteData
                    ((ByteData *)in_stack_ffffffffffffe9f0,
                     (ByteData *)CONCAT44(in_stack_ffffffffffffe9ec,in_stack_ffffffffffffe9e8));
          core::Pubkey::Pubkey(&local_300,&local_318);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_338,"",&local_339);
          core::ByteData::ByteData(&local_358);
          core::KeyData::KeyData(&local_2e8,&local_300,&local_338,&local_358);
          std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
          emplace_back<cfd::core::KeyData>(&local_168,&local_2e8);
          core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe9f0);
          core::ByteData::~ByteData((ByteData *)0x51fbd5);
          std::__cxx11::string::~string((string *)&local_338);
          std::allocator<char>::~allocator((allocator<char> *)&local_339);
          core::Pubkey::~Pubkey((Pubkey *)0x51fbfc);
          core::ByteData::~ByteData((ByteData *)0x51fc09);
          if (in_RDI->address_type == kP2shAddress) {
            in_RDI->address_type = kP2shP2wpkhAddress;
          }
        }
        else {
          core::Script::Script(&local_390,&local_198);
          core::Script::operator=(&in_RDI->redeem_script,&local_390);
          core::Script::~Script((Script *)in_stack_ffffffffffffe9f0);
          if (in_RDI->address_type == kP2shAddress) {
            in_RDI->address_type = kP2shP2wshAddress;
          }
          bVar1 = core::Script::IsP2pkScript(&in_RDI->redeem_script);
          if (bVar1) {
            core::Script::GetElementList(&local_528,&in_RDI->redeem_script);
            pvVar3 = std::
                     vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                     operator[](&local_528,0);
            core::ScriptElement::GetData(&local_510,pvVar3);
            core::Pubkey::Pubkey(&local_4f8,&local_510);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_548,"",&local_549);
            core::ByteData::ByteData(&local_568);
            core::KeyData::KeyData(&local_4e0,&local_4f8,&local_548,&local_568);
            std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
            emplace_back<cfd::core::KeyData>(&local_168,&local_4e0);
            core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffe9f0);
            core::ByteData::~ByteData((ByteData *)0x51feda);
            std::__cxx11::string::~string((string *)&local_548);
            std::allocator<char>::~allocator((allocator<char> *)&local_549);
            core::Pubkey::~Pubkey((Pubkey *)0x51ff01);
            core::ByteData::~ByteData((ByteData *)0x51ff0e);
            std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
            ~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                    CONCAT44(in_stack_ffffffffffffea04,
                             CONCAT13(in_stack_ffffffffffffea03,
                                      CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00))
                            ));
          }
        }
        core::ByteData::~ByteData((ByteData *)0x520014);
      }
    }
  }
  else if ((local_85 & 1) == 0) {
    if (*(long *)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110 + 0x10) != 0) {
      core::ByteData::ByteData
                (&local_a78,
                 *(uint8_t **)(*(long *)((long)local_20 + 0x10) + 0x10 + (ulong)local_14 * 0x110),
                 *(uint32_t *)(*(long *)((long)local_20 + 0x10) + 0x18 + (ulong)local_14 * 0x110));
      core::Script::Script(&local_a60,&local_a78);
      core::Script::operator=(&in_RDI->redeem_script,&local_a60);
      core::Script::~Script((Script *)in_stack_ffffffffffffe9f0);
      core::ByteData::~ByteData((ByteData *)0x5208b6);
    }
    core::Psbt::GetTxInKeyDataList(&local_a90,in_RSI,local_14);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               CONCAT44(in_stack_ffffffffffffea04,
                        CONCAT13(in_stack_ffffffffffffea03,
                                 CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00))),
               (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_ffffffffffffe9f8);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               CONCAT44(in_stack_ffffffffffffea04,
                        CONCAT13(in_stack_ffffffffffffea03,
                                 CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00))));
  }
  else {
    if (*(long *)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110 + 0x20) == 0) {
      if (in_RDI->address_type == kP2shAddress) {
        in_RDI->address_type = kP2shP2wpkhAddress;
      }
    }
    else {
      core::ByteData::ByteData
                (&local_a10,
                 *(uint8_t **)(*(long *)((long)local_20 + 0x10) + 0x20 + (ulong)local_14 * 0x110),
                 *(uint32_t *)(*(long *)((long)local_20 + 0x10) + 0x28 + (ulong)local_14 * 0x110));
      core::Script::Script(&local_9f8,&local_a10);
      core::Script::operator=(&in_RDI->redeem_script,&local_9f8);
      core::Script::~Script((Script *)in_stack_ffffffffffffe9f0);
      core::ByteData::~ByteData((ByteData *)0x520733);
      if (in_RDI->address_type == kP2shAddress) {
        in_RDI->address_type = kP2shP2wshAddress;
      }
    }
    core::Psbt::GetTxInKeyDataList(&local_a28,in_RSI,local_14);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               CONCAT44(in_stack_ffffffffffffea04,
                        CONCAT13(in_stack_ffffffffffffea03,
                                 CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00))),
               (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_ffffffffffffe9f8);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               CONCAT44(in_stack_ffffffffffffea04,
                        CONCAT13(in_stack_ffffffffffffea03,
                                 CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00))));
  }
  error_code = (CfdError)((ulong)in_stack_ffffffffffffea08 >> 0x20);
  if (((local_169 & 1) == 0) &&
     (*(long *)(*(long *)((long)local_20 + 0x10) + (ulong)local_14 * 0x110 + 0x50) == 0))
  goto LAB_00521864;
  bVar1 = core::Script::IsP2wpkhScript(&in_RDI->locking_script);
  error_code = (CfdError)((ulong)in_stack_ffffffffffffea08 >> 0x20);
  if (bVar1) {
LAB_005209f4:
    sVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::size(&local_168);
    if (sVar4 != 1) {
      local_aa8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_psbt.cpp"
                   ,0x2f);
      local_aa8.filename = local_aa8.filename + 1;
      local_aa8.line = 0x34a;
      local_aa8.funcname = "GetUtxoData";
      core::logger::warn<>(&local_aa8,"psbt not supported. many pubkey for p2wpkh.");
      local_aca = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_ac8,"psbt not supported. many pubkey for p2wpkh.",&local_ac9);
      core::CfdException::CfdException
                (in_stack_ffffffffffffea10,error_code,
                 (string *)
                 CONCAT44(in_stack_ffffffffffffea04,
                          CONCAT13(in_stack_ffffffffffffea03,
                                   CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00))));
      local_aca = 0;
      __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    HVar10 = kApostrophe;
    pvVar5 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       (&local_168,0);
    core::KeyData::ToString_abi_cxx11_(&local_b30,pvVar5,true,HVar10,SUB41(HVar10,0));
    std::operator+((char *)in_stack_ffffffffffffe9f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe9f0);
    std::operator+(in_stack_ffffffffffffe9f8,(char *)in_stack_ffffffffffffe9f0);
    std::__cxx11::string::operator=((string *)&in_RDI->descriptor,local_af0);
    std::__cxx11::string::~string(local_af0);
    std::__cxx11::string::~string(local_b10);
    std::__cxx11::string::~string((string *)&local_b30);
    bVar1 = core::Script::IsP2shScript(&in_RDI->locking_script);
    if (bVar1) {
      std::operator+((char *)in_stack_ffffffffffffea38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffea37,
                              CONCAT16(in_stack_ffffffffffffea36,in_stack_ffffffffffffea30)));
      std::operator+(in_stack_ffffffffffffe9f8,(char *)in_stack_ffffffffffffe9f0);
      std::__cxx11::string::operator=((string *)&in_RDI->descriptor,local_b50);
      std::__cxx11::string::~string(local_b50);
      std::__cxx11::string::~string(local_b70);
    }
  }
  else {
    bVar1 = core::Script::IsP2shScript(&in_RDI->locking_script);
    if (bVar1) {
      bVar1 = core::Script::IsEmpty(&in_RDI->redeem_script);
      error_code = (CfdError)((ulong)in_stack_ffffffffffffea08 >> 0x20);
      if (bVar1) goto LAB_005209f4;
    }
    bVar1 = core::Script::IsP2wshScript(&in_RDI->locking_script);
    if (!bVar1) {
      bVar1 = core::Script::IsP2shScript(&in_RDI->locking_script);
      error_code = (CfdError)((ulong)in_stack_ffffffffffffea08 >> 0x20);
      if (!bVar1) {
        bVar1 = core::Script::IsP2pkhScript(&in_RDI->locking_script);
        if (bVar1) {
          sVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::size
                            (&local_168);
          if (sVar4 != 1) {
            local_e08.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_psbt.cpp"
                         ,0x2f);
            local_e08.filename = local_e08.filename + 1;
            local_e08.line = 0x37c;
            local_e08.funcname = "GetUtxoData";
            core::logger::warn<>(&local_e08,"psbt not supported. many pubkey for p2pkh.");
            local_e2a = 1;
            uVar7 = __cxa_allocate_exception(0x30);
            this_00 = (CfdException *)local_e29;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_e29 + 1),"psbt not supported. many pubkey for p2pkh.",
                       (allocator *)this_00);
            core::CfdException::CfdException
                      (this_00,(CfdError)((ulong)uVar7 >> 0x20),
                       (string *)
                       CONCAT44(in_stack_ffffffffffffea04,
                                CONCAT13(in_stack_ffffffffffffea03,
                                         CONCAT12(in_stack_ffffffffffffea02,
                                                  in_stack_ffffffffffffea00))));
            local_e2a = 0;
            __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          in_stack_ffffffffffffea04 = kApostrophe;
          pvVar5 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                             (&local_168,0);
          core::KeyData::ToString_abi_cxx11_
                    (&local_e90,pvVar5,true,in_stack_ffffffffffffea04,
                     SUB41(in_stack_ffffffffffffea04,0));
          std::operator+((char *)in_stack_ffffffffffffe9f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe9f0);
          std::operator+(in_stack_ffffffffffffe9f8,(char *)in_stack_ffffffffffffe9f0);
          std::__cxx11::string::operator=((string *)&in_RDI->descriptor,local_e50);
          std::__cxx11::string::~string(local_e50);
          std::__cxx11::string::~string(local_e70);
          std::__cxx11::string::~string((string *)&local_e90);
        }
        goto LAB_00521864;
      }
    }
    bVar1 = core::Script::IsMultisigScript(&in_RDI->redeem_script);
    error_code = (CfdError)((ulong)in_stack_ffffffffffffea08 >> 0x20);
    if (bVar1) {
      local_b74 = 0;
      core::ScriptUtil::ExtractPubkeysFromMultisigScript
                (&local_b90,&in_RDI->redeem_script,&local_b74);
      std::__cxx11::to_string(in_stack_ffffffffffffea1c);
      std::operator+((char *)in_stack_ffffffffffffe9f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe9f0);
      std::__cxx11::string::operator=((string *)&in_RDI->descriptor,local_bb0);
      std::__cxx11::string::~string(local_bb0);
      std::__cxx11::string::~string(local_bd0);
      local_bd8 = &local_b90;
      local_be0._M_current =
           (Pubkey *)
           std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                     ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                      CONCAT44(in_stack_ffffffffffffe9ec,in_stack_ffffffffffffe9e8));
      local_be8._M_current =
           (Pubkey *)
           std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                     ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                      CONCAT44(in_stack_ffffffffffffe9ec,in_stack_ffffffffffffe9e8));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&local_be0,&local_be8);
        error_code = (CfdError)((ulong)in_stack_ffffffffffffea08 >> 0x20);
        if (!bVar1) break;
        local_bf0 = __gnu_cxx::
                    __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                    ::operator*(&local_be0);
        local_bf1 = 0;
        local_c00 = &local_168;
        local_c08._M_current =
             (KeyData *)
             std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin(local_c00);
        local_c10._M_current =
             (KeyData *)
             std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end(local_c00);
        while (bVar1 = __gnu_cxx::operator!=(&local_c08,&local_c10), bVar1) {
          local_c18 = __gnu_cxx::
                      __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                      ::operator*(&local_c08);
          in_stack_ffffffffffffea38 = local_bf0;
          core::KeyData::GetPubkey(&local_c30,local_c18);
          in_stack_ffffffffffffea37 = core::Pubkey::Equals(in_stack_ffffffffffffea38,&local_c30);
          core::Pubkey::~Pubkey((Pubkey *)0x520f32);
          if ((in_stack_ffffffffffffea37 & 1) != 0) {
            core::KeyData::ToString_abi_cxx11_(&local_c70,local_c18,true,kApostrophe,false);
            std::operator+((char *)in_stack_ffffffffffffe9f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe9f0);
            std::__cxx11::string::operator+=((string *)&in_RDI->descriptor,local_c50);
            std::__cxx11::string::~string(local_c50);
            std::__cxx11::string::~string((string *)&local_c70);
            local_bf1 = 1;
          }
          __gnu_cxx::
          __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
          ::operator++(&local_c08);
        }
        if ((local_bf1 & 1) == 0) {
          core::Pubkey::GetHex_abi_cxx11_(&local_cb0,local_bf0);
          std::operator+((char *)in_stack_ffffffffffffe9f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe9f0);
          std::__cxx11::string::operator+=((string *)&in_RDI->descriptor,local_c90);
          std::__cxx11::string::~string(local_c90);
          std::__cxx11::string::~string((string *)&local_cb0);
        }
        __gnu_cxx::
        __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
        ::operator++(&local_be0);
      }
      std::__cxx11::string::operator+=((string *)&in_RDI->descriptor,")");
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                 CONCAT44(in_stack_ffffffffffffea04,
                          CONCAT13(in_stack_ffffffffffffea03,
                                   CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00))));
    }
    else {
      in_stack_ffffffffffffea36 = core::Script::IsP2pkScript(&in_RDI->redeem_script);
      if ((bool)in_stack_ffffffffffffea36) {
        sVar4 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::size
                          (&local_168);
        if (sVar4 != 1) {
          local_cc8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_psbt.cpp"
                       ,0x2f);
          local_cc8.filename = local_cc8.filename + 1;
          local_cc8.line = 0x36a;
          local_cc8.funcname = "GetUtxoData";
          core::logger::warn<>(&local_cc8,"psbt not supported. many pubkey for p2pkh.");
          local_cea = 1;
          uVar7 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_ce8,"psbt not supported. many pubkey for p2pkh.",&local_ce9);
          core::CfdException::CfdException
                    (in_stack_ffffffffffffea10,error_code,
                     (string *)
                     CONCAT44(in_stack_ffffffffffffea04,
                              CONCAT13(in_stack_ffffffffffffea03,
                                       CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00)
                                      )));
          local_cea = 0;
          __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        HVar10 = kApostrophe;
        pvVar5 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                           (&local_168,0);
        core::KeyData::ToString_abi_cxx11_(&local_d50,pvVar5,true,HVar10,SUB41(HVar10,0));
        std::operator+((char *)in_stack_ffffffffffffe9f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe9f0);
        std::operator+(in_stack_ffffffffffffe9f8,(char *)in_stack_ffffffffffffe9f0);
        std::__cxx11::string::operator=((string *)&in_RDI->descriptor,local_d10);
        std::__cxx11::string::~string(local_d10);
        std::__cxx11::string::~string(local_d30);
        std::__cxx11::string::~string((string *)&local_d50);
      }
      else {
        core::Script::GetHex_abi_cxx11_(&local_d70,&in_RDI->redeem_script);
        std::__cxx11::string::operator=((string *)&in_RDI->descriptor,(string *)&local_d70);
        std::__cxx11::string::~string((string *)&local_d70);
      }
    }
    if ((local_85 & 1) != 0) {
      std::operator+((char *)in_stack_ffffffffffffea38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffea37,
                              CONCAT16(in_stack_ffffffffffffea36,in_stack_ffffffffffffea30)));
      std::operator+(in_stack_ffffffffffffe9f8,(char *)in_stack_ffffffffffffe9f0);
      std::__cxx11::string::operator=((string *)&in_RDI->descriptor,local_d90);
      std::__cxx11::string::~string(local_d90);
      std::__cxx11::string::~string(local_db0);
    }
    bVar1 = core::Script::IsP2shScript(&in_RDI->locking_script);
    if (bVar1) {
      std::operator+((char *)in_stack_ffffffffffffea38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffea37,
                              CONCAT16(in_stack_ffffffffffffea36,in_stack_ffffffffffffea30)));
      std::operator+(in_stack_ffffffffffffe9f8,(char *)in_stack_ffffffffffffe9f0);
      std::__cxx11::string::operator=((string *)&in_RDI->descriptor,local_dd0);
      std::__cxx11::string::~string(local_dd0);
      std::__cxx11::string::~string(local_df0);
    }
  }
LAB_00521864:
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    core::Descriptor::Parse
              (&local_ff8,&in_RDI->descriptor,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0);
    core::Descriptor::GetReference
              (&local_1348,&local_ff8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    core::DescriptorScriptReference::GetLockingScript(&local_1380,&local_1348);
    in_stack_ffffffffffffea03 = core::Script::Equals(&local_1380,&in_RDI->locking_script);
    in_stack_ffffffffffffea02 = in_stack_ffffffffffffea03 ^ 0xff;
    core::Script::~Script((Script *)in_stack_ffffffffffffe9f0);
    if ((in_stack_ffffffffffffea02 & 1) != 0) {
      local_1398.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_psbt.cpp"
                   ,0x2f);
      local_1398.filename = local_1398.filename + 1;
      local_1398.line = 0x38b;
      local_1398.funcname = "GetUtxoData";
      core::logger::warn<>(&local_1398,"psbt invalid state. unmatch descriptor & lockingScript.");
      local_13ba = 1;
      uVar7 = __cxa_allocate_exception(0x30);
      paVar9 = &local_13b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_13b8,"psbt invalid state. unmatch descriptor & lockingScript.",paVar9);
      core::CfdException::CfdException
                (in_stack_ffffffffffffea10,error_code,
                 (string *)
                 CONCAT44(in_stack_ffffffffffffea04,
                          CONCAT13(in_stack_ffffffffffffea03,
                                   CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00))));
      local_13ba = 0;
      __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::DescriptorScriptReference::GenerateAddress(&local_1538,&local_1348,local_18);
    core::Address::operator=(&in_RDI->address,&local_1538);
    core::Address::~Address((Address *)in_stack_ffffffffffffe9f0);
    AVar2 = core::DescriptorScriptReference::GetAddressType(&local_1348);
    in_RDI->address_type = AVar2;
    core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)in_stack_ffffffffffffe9f0);
    core::Descriptor::~Descriptor((Descriptor *)0x521b24);
  }
  local_21 = 1;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             CONCAT44(in_stack_ffffffffffffea04,
                      CONCAT13(in_stack_ffffffffffffea03,
                               CONCAT12(in_stack_ffffffffffffea02,in_stack_ffffffffffffea00))));
  if ((local_21 & 1) == 0) {
    UtxoData::~UtxoData(in_stack_ffffffffffffe9f0);
  }
  return in_RDI;
}

Assistant:

UtxoData Psbt::GetUtxoData(uint32_t index, NetType net_type) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
  UtxoData utxo;
  utxo.block_height = 0;
  utxo.address_type = AddressType::kP2shAddress;

  utxo.txid = Txid(ByteData256(ByteData(
      psbt_pointer->tx->inputs[index].txhash,
      sizeof(psbt_pointer->tx->inputs[index].txhash))));
  utxo.vout = psbt_pointer->tx->inputs[index].index;

  bool witness_only = false;
  if (psbt_pointer->inputs[index].witness_utxo != nullptr) {
    utxo.amount = Amount(static_cast<int64_t>(
        psbt_pointer->inputs[index].witness_utxo->satoshi));
    utxo.locking_script = Script(ByteData(
        psbt_pointer->inputs[index].witness_utxo->script,
        static_cast<uint32_t>(
            psbt_pointer->inputs[index].witness_utxo->script_len)));
    witness_only = true;
  } else if (psbt_pointer->inputs[index].utxo != nullptr) {
    if (psbt_pointer->inputs[index].utxo->num_outputs > utxo.vout) {
      auto output = &psbt_pointer->inputs[index].utxo->outputs[utxo.vout];
      utxo.amount = Amount(static_cast<int64_t>(output->satoshi));
      utxo.locking_script = Script(
          ByteData(output->script, static_cast<uint32_t>(output->script_len)));
    }
  }
  if (utxo.locking_script.IsP2shScript()) {
    utxo.address_type = AddressType::kP2shAddress;
  } else if (utxo.locking_script.IsP2pkhScript()) {
    utxo.address_type = AddressType::kP2pkhAddress;
  } else if (utxo.locking_script.IsP2wpkhScript()) {
    utxo.address_type = AddressType::kP2wpkhAddress;
  } else if (utxo.locking_script.IsP2wshScript()) {
    utxo.address_type = AddressType::kP2wshAddress;
  }

  std::vector<KeyData> key_list;
  bool is_finalized = IsFinalizedInput(index);
  if (is_finalized) {
    if (witness_only &&
        (psbt_pointer->inputs[index].final_witness != nullptr)) {
      auto witness_stack = psbt_pointer->inputs[index].final_witness;
      uint32_t last_index = static_cast<uint32_t>(witness_stack->num_items);
      if (last_index > 0) {
        ByteData last_data(
            witness_stack->items[last_index - 1].witness,
            static_cast<uint32_t>(
                witness_stack->items[last_index - 1].witness_len));
        if (Pubkey::IsValid(last_data)) {
          key_list.emplace_back(KeyData(Pubkey(last_data), "", ByteData()));
          if (utxo.address_type == AddressType::kP2shAddress) {
            utxo.address_type = AddressType::kP2shP2wpkhAddress;
          }
        } else {
          utxo.redeem_script = Script(last_data);
          if (utxo.address_type == AddressType::kP2shAddress) {
            utxo.address_type = AddressType::kP2shP2wshAddress;
          }
          if (utxo.redeem_script.IsP2pkScript()) {
            key_list.emplace_back(KeyData(
                Pubkey(utxo.redeem_script.GetElementList()[0].GetData()), "",
                ByteData()));
          }
        }
      }
    } else if (psbt_pointer->inputs[index].final_scriptsig != nullptr) {
      Script scriptsig(ByteData(
          psbt_pointer->inputs[index].final_scriptsig,
          static_cast<uint32_t>(
              psbt_pointer->inputs[index].final_scriptsig_len)));
      auto items = scriptsig.GetElementList();
      uint32_t last_index = static_cast<uint32_t>(items.size());
      if (last_index > 0) {
        ByteData last_data = items[last_index - 1].GetBinaryData();
        if (Pubkey::IsValid(last_data)) {
          key_list.emplace_back(KeyData(Pubkey(last_data), "", ByteData()));
        } else {
          utxo.redeem_script = Script(last_data);
          if (utxo.redeem_script.IsP2pkScript()) {
            key_list.emplace_back(KeyData(
                Pubkey(utxo.redeem_script.GetElementList()[0].GetData()), "",
                ByteData()));
          }
        }
      }
    }
  } else if (witness_only) {
    if (psbt_pointer->inputs[index].witness_script != nullptr) {
      utxo.redeem_script = Script(ByteData(
          psbt_pointer->inputs[index].witness_script,
          static_cast<uint32_t>(
              psbt_pointer->inputs[index].witness_script_len)));
      if (utxo.address_type == AddressType::kP2shAddress) {
        utxo.address_type = AddressType::kP2shP2wshAddress;
      }
    } else if (utxo.address_type == AddressType::kP2shAddress) {
      utxo.address_type = AddressType::kP2shP2wpkhAddress;
    }

    key_list = cfd::core::Psbt::GetTxInKeyDataList(index);
  } else {
    if (psbt_pointer->inputs[index].redeem_script != nullptr) {
      utxo.redeem_script = Script(ByteData(
          psbt_pointer->inputs[index].redeem_script,
          static_cast<uint32_t>(
              psbt_pointer->inputs[index].redeem_script_len)));
    }
    key_list = cfd::core::Psbt::GetTxInKeyDataList(index);
  }

  if ((!is_finalized) &&
      (psbt_pointer->inputs[index].keypaths.num_items == 0)) {
    // unset descriptor
  } else if (
      utxo.locking_script.IsP2wpkhScript() ||
      (utxo.locking_script.IsP2shScript() && utxo.redeem_script.IsEmpty())) {
    if (key_list.size() != 1) {
      warn(CFD_LOG_SOURCE, "psbt not supported. many pubkey for p2wpkh.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "psbt not supported. many pubkey for p2wpkh.");
    }
    utxo.descriptor = "wpkh(" + key_list[0].ToString() + ")";
    if (utxo.locking_script.IsP2shScript()) {
      utxo.descriptor = "sh(" + utxo.descriptor + ")";
    }
  } else if (
      utxo.locking_script.IsP2wshScript() ||
      utxo.locking_script.IsP2shScript()) {
    if (utxo.redeem_script.IsMultisigScript()) {
      uint32_t req_num = 0;
      auto multisig_key_list = ScriptUtil::ExtractPubkeysFromMultisigScript(
          utxo.redeem_script, &req_num);
      utxo.descriptor = "multi(" + std::to_string(req_num);
      for (const auto& pubkey : multisig_key_list) {
        bool is_find = false;
        for (const auto& key : key_list) {
          if (pubkey.Equals(key.GetPubkey())) {
            utxo.descriptor += "," + key.ToString();
            is_find = true;
          }
        }
        if (!is_find) {
          utxo.descriptor += "," + pubkey.GetHex();
        }
      }
      utxo.descriptor += ")";
    } else if (utxo.redeem_script.IsP2pkScript()) {
      if (key_list.size() != 1) {
        warn(CFD_LOG_SOURCE, "psbt not supported. many pubkey for p2pkh.");
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "psbt not supported. many pubkey for p2pkh.");
      }
      utxo.descriptor = "pkh(" + key_list[0].ToString() + ")";
    } else {
      // not key support
      utxo.descriptor = utxo.redeem_script.GetHex();
    }
    if (witness_only) {
      utxo.descriptor = "wsh(" + utxo.descriptor + ")";
    }
    if (utxo.locking_script.IsP2shScript()) {
      utxo.descriptor = "sh(" + utxo.descriptor + ")";
    }
  } else if (utxo.locking_script.IsP2pkhScript()) {
    if (key_list.size() != 1) {
      warn(CFD_LOG_SOURCE, "psbt not supported. many pubkey for p2pkh.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "psbt not supported. many pubkey for p2pkh.");
    }
    utxo.descriptor = "pkh(" + key_list[0].ToString() + ")";
  } else {
    // unsupported format
  }

  if (!utxo.descriptor.empty()) {
    Descriptor desc = Descriptor::Parse(utxo.descriptor);
    auto ref = desc.GetReference();
    if (!ref.GetLockingScript().Equals(utxo.locking_script)) {
      warn(
          CFD_LOG_SOURCE,
          "psbt invalid state. unmatch descriptor & lockingScript.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "psbt invalid state. unmatch descriptor & lockingScript.");
    }
    utxo.address = ref.GenerateAddress(net_type);
    utxo.address_type = ref.GetAddressType();
  }

  return utxo;
}